

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_compiler_get_declared_capabilities
          (spvc_compiler compiler,SpvCapability **capabilities,size_t *num_capabilities)

{
  SmallVector<spv::Capability,_8UL> *pSVar1;
  
  pSVar1 = spirv_cross::Compiler::get_declared_capabilities
                     ((compiler->compiler)._M_t.
                      super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                      .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
  *capabilities = (pSVar1->super_VectorView<spv::Capability>).ptr;
  *num_capabilities = (pSVar1->super_VectorView<spv::Capability>).buffer_size;
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_declared_capabilities(spvc_compiler compiler, const SpvCapability **capabilities,
                                                    size_t *num_capabilities)
{
	auto &caps = compiler->compiler->get_declared_capabilities();
	static_assert(sizeof(SpvCapability) == sizeof(spv::Capability), "Enum size mismatch.");
	*capabilities = reinterpret_cast<const SpvCapability *>(caps.data());
	*num_capabilities = caps.size();
	return SPVC_SUCCESS;
}